

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O0

SI_Error __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::SetLongValue
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char *a_pSection,
          char *a_pKey,long a_nValue,char *a_pComment,bool a_bUseHex,bool a_bForceReplace)

{
  size_t sVar1;
  char *__format;
  SI_ConvertA<char> local_c9;
  char local_c8 [7];
  SI_ConvertA<char> c;
  char szOutput [64];
  char szInput [64];
  bool a_bForceReplace_local;
  bool a_bUseHex_local;
  char *a_pComment_local;
  long a_nValue_local;
  char *a_pKey_local;
  char *a_pSection_local;
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this_local;
  
  if ((a_pSection == (char *)0x0) || (a_pKey == (char *)0x0)) {
    this_local._4_4_ = SI_FAIL;
  }
  else {
    __format = "%ld";
    if (a_bUseHex) {
      __format = "0x%lx";
    }
    sprintf(szOutput + 0x38,__format,a_nValue);
    SI_ConvertA<char>::SI_ConvertA(&local_c9,(bool)(this->m_bStoreIsUtf8 & 1));
    sVar1 = strlen(szOutput + 0x38);
    SI_ConvertA<char>::ConvertFromStore(&local_c9,szOutput + 0x38,sVar1 + 1,local_c8,0x40);
    this_local._4_4_ = AddEntry(this,a_pSection,a_pKey,local_c8,a_pComment,a_bForceReplace,true);
  }
  return this_local._4_4_;
}

Assistant:

SI_Error CSimpleIniTempl<SI_CHAR, SI_STRLESS, SI_CONVERTER>::SetLongValue(const SI_CHAR *a_pSection,
																		  const SI_CHAR *a_pKey, long a_nValue,
																		  const SI_CHAR *a_pComment, bool a_bUseHex,
																		  bool a_bForceReplace) {
	// use SetValue to create sections
	if (!a_pSection || !a_pKey) return SI_FAIL;

	// convert to an ASCII string
	char szInput[64];
#if __STDC_WANT_SECURE_LIB__ && !_WIN32_WCE
	sprintf_s(szInput, a_bUseHex ? "0x%lx" : "%ld", a_nValue);
#else  // !__STDC_WANT_SECURE_LIB__
	sprintf(szInput, a_bUseHex ? "0x%lx" : "%ld", a_nValue);
#endif  // __STDC_WANT_SECURE_LIB__

	// convert to output text
	SI_CHAR szOutput[64];
	SI_CONVERTER c(m_bStoreIsUtf8);
	c.ConvertFromStore(szInput, strlen(szInput) + 1, szOutput, sizeof(szOutput) / sizeof(SI_CHAR));

	// actually add it
	return AddEntry(a_pSection, a_pKey, szOutput, a_pComment, a_bForceReplace, true);
}